

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  ulong *iEnd;
  undefined8 *puVar1;
  int *piVar2;
  ulong *puVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  bool bVar7;
  undefined8 uVar8;
  char cVar9;
  char cVar10;
  ulong *puVar11;
  size_t sVar12;
  ulong uVar13;
  seqDef *psVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  U32 UVar18;
  ulong *puVar19;
  ulong *puVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong *puVar26;
  BYTE *pBVar27;
  U32 maxDistance;
  uint uVar28;
  BYTE *pBVar29;
  uint uVar30;
  ulong uVar31;
  BYTE *pBVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  BYTE *pBVar36;
  long lVar37;
  ulong *puVar38;
  long lVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  BYTE *pInLoopLimit;
  int iVar43;
  ulong uVar44;
  U32 UVar45;
  BYTE *litEnd_2;
  uint uVar46;
  uint uVar47;
  BYTE *litEnd;
  ulong *puVar48;
  ulong *puVar49;
  BYTE *litLimit_w_2;
  BYTE *litLimit_w;
  
  pUVar4 = ms->hashTable;
  iEnd = (ulong *)((long)src + srcSize);
  pBVar5 = (ms->window).base;
  iVar43 = (int)pBVar5;
  iVar41 = (int)iEnd - iVar43;
  uVar40 = (ms->window).lowLimit;
  uVar28 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar47 = uVar40;
  if (uVar28 < iVar41 - uVar40) {
    uVar47 = iVar41 - uVar28;
  }
  UVar18 = ms->loadedDictEnd;
  if (UVar18 != 0) {
    uVar47 = uVar40;
  }
  puVar3 = (ulong *)((long)src + (srcSize - 8));
  pUVar6 = ms->chainTable;
  uVar40 = (ms->window).dictLimit;
  uVar30 = *rep;
  uVar34 = rep[1];
  cVar10 = (char)(ms->cParams).hashLog;
  cVar9 = (char)(ms->cParams).chainLog;
  if (uVar47 < uVar40) {
    if (src < puVar3) {
      pBVar27 = (ms->window).dictBase;
      puVar49 = (ulong *)(pBVar5 + uVar40);
      puVar24 = (ulong *)(pBVar27 + uVar47);
      puVar19 = (ulong *)(pBVar27 + uVar40);
      bVar15 = 0x40 - cVar9;
      bVar16 = 0x20 - cVar9;
      bVar17 = 0x40 - cVar10;
      puVar11 = iEnd + -4;
      iVar41 = mls - 5;
      puVar48 = (ulong *)src;
      do {
        switch(iVar41) {
        case 0:
          uVar21 = *puVar48;
          lVar39 = -0x30e4432345000000;
          break;
        case 1:
          uVar21 = *puVar48;
          lVar39 = -0x30e4432340650000;
          break;
        case 2:
          uVar21 = *puVar48;
          lVar39 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar21 = *puVar48;
          uVar25 = uVar21 * -0x30e44323485a9b9d;
          goto LAB_0069da70;
        default:
          uVar25 = (ulong)((uint)((int)*puVar48 * -0x61c8864f) >> (bVar16 & 0x1f));
          uVar21 = *puVar48;
          goto LAB_0069da78;
        }
        uVar25 = lVar39 * uVar21;
LAB_0069da70:
        uVar25 = uVar25 >> (bVar15 & 0x3f);
LAB_0069da78:
        uVar28 = pUVar6[uVar25];
        pBVar32 = pBVar5;
        if (uVar28 < uVar40) {
          pBVar32 = pBVar27;
        }
        uVar35 = uVar21 * -0x30e44323485a9b9d >> (bVar17 & 0x3f);
        uVar33 = pUVar4[uVar35];
        pBVar29 = pBVar5;
        if (uVar33 < uVar40) {
          pBVar29 = pBVar27;
        }
        UVar45 = (int)puVar48 - iVar43;
        UVar18 = UVar45 + 1;
        uVar46 = UVar18 - uVar30;
        pUVar4[uVar35] = UVar45;
        pBVar36 = pBVar5;
        if (uVar46 < uVar40) {
          pBVar36 = pBVar27;
        }
        pUVar6[uVar25] = UVar45;
        if (((uVar30 < UVar18 - uVar47) && (2 < (uVar40 - 1) - uVar46)) &&
           (*(int *)(pBVar36 + uVar46) == *(int *)((long)puVar48 + 1))) {
          puVar38 = (ulong *)((long)puVar48 + 1);
          puVar26 = iEnd;
          if (uVar46 < uVar40) {
            puVar26 = puVar19;
          }
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar48 + 5),(BYTE *)((long)(pBVar36 + uVar46) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar26,(BYTE *)puVar49);
          uVar25 = (long)puVar38 - (long)src;
          puVar48 = (ulong *)seqStore->lit;
          if (puVar11 < puVar38) {
            puVar26 = puVar48;
            puVar20 = (ulong *)src;
            if (src <= puVar11) {
              puVar26 = (ulong *)((long)puVar48 + ((long)puVar11 - (long)src));
              uVar21 = *(ulong *)((long)src + 8);
              *puVar48 = *src;
              puVar48[1] = uVar21;
              puVar20 = puVar11;
              if (0x10 < (long)puVar11 - (long)src) {
                lVar39 = 0x10;
                do {
                  uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar39) + 8);
                  puVar1 = (undefined8 *)((long)puVar48 + lVar39);
                  *puVar1 = *(undefined8 *)((long)src + lVar39);
                  puVar1[1] = uVar8;
                  pBVar32 = (BYTE *)((long)src + lVar39 + 0x10);
                  uVar8 = *(undefined8 *)(pBVar32 + 8);
                  puVar1[2] = *(undefined8 *)pBVar32;
                  puVar1[3] = uVar8;
                  lVar39 = lVar39 + 0x20;
                } while (puVar1 + 4 < puVar26);
              }
            }
            if (puVar20 < puVar38) {
              lVar39 = 0;
              do {
                *(BYTE *)((long)puVar26 + lVar39) = *(BYTE *)((long)puVar20 + lVar39);
                lVar39 = lVar39 + 1;
              } while ((long)puVar38 - (long)puVar20 != lVar39);
            }
LAB_0069e164:
            seqStore->lit = seqStore->lit + uVar25;
            psVar14 = seqStore->sequences;
            if (0xffff < uVar25) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar21 = *(ulong *)((long)src + 8);
            *puVar48 = *src;
            puVar48[1] = uVar21;
            pBVar32 = seqStore->lit;
            if (0x10 < uVar25) {
              uVar21 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar32 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar32 + 0x18) = uVar21;
              if (0x20 < (long)uVar25) {
                lVar39 = 0;
                do {
                  pBVar36 = (BYTE *)((long)src + lVar39 + 0x20);
                  uVar8 = *(undefined8 *)(pBVar36 + 8);
                  pBVar29 = pBVar32 + lVar39 + 0x20;
                  *(undefined8 *)pBVar29 = *(undefined8 *)pBVar36;
                  *(undefined8 *)(pBVar29 + 8) = uVar8;
                  pBVar36 = (BYTE *)((long)src + lVar39 + 0x30);
                  uVar8 = *(undefined8 *)(pBVar36 + 8);
                  *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)pBVar36;
                  *(undefined8 *)(pBVar29 + 0x18) = uVar8;
                  lVar39 = lVar39 + 0x20;
                } while (pBVar29 + 0x20 < pBVar32 + uVar25);
              }
              goto LAB_0069e164;
            }
            seqStore->lit = pBVar32 + uVar25;
            psVar14 = seqStore->sequences;
          }
          lVar39 = sVar12 + 4;
          uVar21 = sVar12 + 1;
          psVar14->litLength = (U16)uVar25;
          psVar14->offset = 1;
          uVar33 = uVar30;
LAB_0069e343:
          if (0xffff < uVar21) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
          puVar48 = (ulong *)(lVar39 + (long)puVar38);
          psVar14->matchLength = (U16)uVar21;
          psVar14 = psVar14 + 1;
          seqStore->sequences = psVar14;
          src = puVar48;
          uVar30 = uVar33;
          if (puVar3 < puVar48) goto LAB_0069e5db;
          uVar28 = UVar45 + 2;
          lVar39 = *(long *)(pBVar5 + uVar28);
          uVar21 = lVar39 * -0x30e44323485a9b9d;
          pUVar4[uVar21 >> (bVar17 & 0x3f)] = uVar28;
          pUVar4[(ulong)(*(long *)((long)puVar48 + -2) * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] =
               ((int)puVar48 + -2) - iVar43;
          switch(iVar41) {
          case 0:
            lVar37 = -0x30e4432345000000;
            break;
          case 1:
            lVar37 = -0x30e4432340650000;
            break;
          case 2:
            lVar37 = -0x30e44323405a9d00;
            break;
          case 3:
            pUVar6[uVar21 >> (bVar15 & 0x3f)] = uVar28;
            uVar21 = *(long *)((long)puVar48 + -1) * -0x30e44323485a9b9d;
            goto LAB_0069e443;
          default:
            pUVar6[(uint)(*(int *)(pBVar5 + uVar28) * -0x61c8864f) >> (bVar16 & 0x1f)] = uVar28;
            uVar21 = (ulong)((uint)(*(int *)((long)puVar48 + -1) * -0x61c8864f) >> (bVar16 & 0x1f));
            goto LAB_0069e446;
          }
          pUVar6[(ulong)(lVar39 * lVar37) >> (bVar15 & 0x3f)] = uVar28;
          uVar21 = lVar37 * *(long *)((long)puVar48 + -1);
LAB_0069e443:
          uVar21 = uVar21 >> (bVar15 & 0x3f);
LAB_0069e446:
          pUVar6[uVar21] = ((int)puVar48 + -1) - iVar43;
          do {
            uVar46 = uVar34;
            UVar18 = (int)puVar48 - iVar43;
            uVar28 = UVar18 - uVar46;
            pBVar32 = pBVar5;
            if (uVar28 < uVar40) {
              pBVar32 = pBVar27;
            }
            src = puVar48;
            uVar30 = uVar33;
            uVar34 = uVar46;
            if (((UVar18 - uVar47 <= uVar46) || ((uVar40 - 1) - uVar28 < 3)) ||
               (*(int *)(pBVar32 + uVar28) != (int)*puVar48)) break;
            puVar38 = iEnd;
            if (uVar28 < uVar40) {
              puVar38 = puVar19;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar48 + 4),(BYTE *)((long)(pBVar32 + uVar28) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar38,(BYTE *)puVar49);
            if (puVar48 <= puVar11) {
              puVar38 = (ulong *)seqStore->lit;
              uVar21 = puVar48[1];
              *puVar38 = *puVar48;
              puVar38[1] = uVar21;
              psVar14 = seqStore->sequences;
            }
            psVar14->litLength = 0;
            psVar14->offset = 1;
            if (0xffff < sVar12 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar14->matchLength = (U16)(sVar12 + 1);
            psVar14 = psVar14 + 1;
            seqStore->sequences = psVar14;
            switch(iVar41) {
            case 0:
              uVar21 = *puVar48;
              lVar39 = -0x30e4432345000000;
              break;
            case 1:
              uVar21 = *puVar48;
              lVar39 = -0x30e4432340650000;
              break;
            case 2:
              uVar21 = *puVar48;
              lVar39 = -0x30e44323405a9d00;
              break;
            case 3:
              uVar21 = *puVar48;
              uVar25 = uVar21 * -0x30e44323485a9b9d;
              goto LAB_0069e57e;
            default:
              uVar25 = (ulong)((uint)((int)*puVar48 * -0x61c8864f) >> (bVar16 & 0x1f));
              uVar21 = *puVar48;
              goto LAB_0069e586;
            }
            uVar25 = lVar39 * uVar21;
LAB_0069e57e:
            uVar25 = uVar25 >> (bVar15 & 0x3f);
LAB_0069e586:
            pUVar6[uVar25] = UVar18;
            pUVar4[uVar21 * -0x30e44323485a9b9d >> (bVar17 & 0x3f)] = UVar18;
            puVar48 = (ulong *)((long)puVar48 + sVar12 + 4);
            src = puVar48;
            uVar30 = uVar46;
            uVar34 = uVar33;
            uVar33 = uVar46;
          } while (puVar48 <= puVar3);
        }
        else {
          puVar38 = puVar48;
          if ((uVar47 < uVar33) && (puVar26 = (ulong *)(pBVar29 + uVar33), *puVar26 == uVar21)) {
            puVar22 = puVar49;
            puVar20 = iEnd;
            if (uVar33 < uVar40) {
              puVar22 = puVar24;
              puVar20 = puVar19;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)(puVar48 + 1),(BYTE *)(puVar26 + 1),(BYTE *)iEnd,
                                (BYTE *)puVar20,(BYTE *)puVar49);
            lVar39 = sVar12 + 8;
            if ((puVar22 < puVar26) && (src < puVar48)) {
              puVar26 = (ulong *)(pBVar29 + uVar33);
              do {
                puVar26 = (ulong *)((long)puVar26 + -1);
                puVar20 = (ulong *)((long)puVar48 + -1);
                puVar38 = puVar48;
                if ((*(BYTE *)puVar20 != *(BYTE *)puVar26) ||
                   (lVar39 = lVar39 + 1, puVar38 = puVar20, puVar26 <= puVar22)) break;
                puVar48 = puVar20;
              } while (src < puVar20);
            }
            uVar21 = (long)puVar38 - (long)src;
            puVar48 = (ulong *)seqStore->lit;
            if (puVar11 < puVar38) {
              puVar26 = puVar48;
              puVar20 = (ulong *)src;
              if (src <= puVar11) {
                puVar26 = (ulong *)((long)puVar48 + ((long)puVar11 - (long)src));
                uVar25 = *(ulong *)((long)src + 8);
                *puVar48 = *src;
                puVar48[1] = uVar25;
                puVar20 = puVar11;
                if (0x10 < (long)puVar11 - (long)src) {
                  lVar37 = 0x10;
                  do {
                    uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar37) + 8);
                    puVar1 = (undefined8 *)((long)puVar48 + lVar37);
                    *puVar1 = *(undefined8 *)((long)src + lVar37);
                    puVar1[1] = uVar8;
                    pBVar32 = (BYTE *)((long)src + lVar37 + 0x10);
                    uVar8 = *(undefined8 *)(pBVar32 + 8);
                    puVar1[2] = *(undefined8 *)pBVar32;
                    puVar1[3] = uVar8;
                    lVar37 = lVar37 + 0x20;
                  } while (puVar1 + 4 < puVar26);
                }
              }
              if (puVar20 < puVar38) {
                lVar37 = 0;
                do {
                  *(BYTE *)((long)puVar26 + lVar37) = *(BYTE *)((long)puVar20 + lVar37);
                  lVar37 = lVar37 + 1;
                } while ((long)puVar38 - (long)puVar20 != lVar37);
              }
LAB_0069e097:
              seqStore->lit = seqStore->lit + uVar21;
              psVar14 = seqStore->sequences;
              if (0xffff < uVar21) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              uVar25 = *(ulong *)((long)src + 8);
              *puVar48 = *src;
              puVar48[1] = uVar25;
              pBVar32 = seqStore->lit;
              if (0x10 < uVar21) {
                uVar25 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar32 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar32 + 0x18) = uVar25;
                if (0x20 < (long)uVar21) {
                  lVar37 = 0;
                  do {
                    pBVar36 = (BYTE *)((long)src + lVar37 + 0x20);
                    uVar8 = *(undefined8 *)(pBVar36 + 8);
                    pBVar29 = pBVar32 + lVar37 + 0x20;
                    *(undefined8 *)pBVar29 = *(undefined8 *)pBVar36;
                    *(undefined8 *)(pBVar29 + 8) = uVar8;
                    pBVar36 = (BYTE *)((long)src + lVar37 + 0x30);
                    uVar8 = *(undefined8 *)(pBVar36 + 8);
                    *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)pBVar36;
                    *(undefined8 *)(pBVar29 + 0x18) = uVar8;
                    lVar37 = lVar37 + 0x20;
                  } while (pBVar29 + 0x20 < pBVar32 + uVar21);
                }
                goto LAB_0069e097;
              }
              seqStore->lit = pBVar32 + uVar21;
              psVar14 = seqStore->sequences;
            }
            uVar33 = UVar45 - uVar33;
            psVar14->litLength = (U16)uVar21;
            psVar14->offset = uVar33 + 3;
LAB_0069e341:
            uVar21 = lVar39 - 3;
            uVar34 = uVar30;
            goto LAB_0069e343;
          }
          if ((uVar47 < uVar28) &&
             (puVar26 = (ulong *)(pBVar32 + uVar28), (int)*puVar26 == (int)*puVar48)) {
            uVar21 = *(ulong *)((long)puVar48 + 1);
            uVar25 = uVar21 * -0x30e44323485a9b9d >> (bVar17 & 0x3f);
            uVar34 = pUVar4[uVar25];
            pBVar29 = pBVar5;
            if (uVar34 < uVar40) {
              pBVar29 = pBVar27;
            }
            pUVar4[uVar25] = UVar18;
            if ((uVar47 < uVar34) && (puVar20 = (ulong *)(pBVar29 + uVar34), *puVar20 == uVar21)) {
              puVar38 = (ulong *)((long)puVar48 + 1);
              puVar22 = puVar49;
              puVar26 = iEnd;
              if (uVar34 < uVar40) {
                puVar22 = puVar24;
                puVar26 = puVar19;
              }
              sVar12 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar48 + 9),(BYTE *)(puVar20 + 1),(BYTE *)iEnd,
                                  (BYTE *)puVar26,(BYTE *)puVar49);
              lVar39 = sVar12 + 8;
              uVar33 = UVar18 - uVar34;
              if ((puVar22 < puVar20) && (src < puVar38)) {
                puVar26 = (ulong *)(pBVar29 + uVar34);
                while (puVar38 = puVar48, puVar26 = (ulong *)((long)puVar26 + -1),
                      (BYTE)*puVar38 == *(BYTE *)puVar26) {
                  lVar39 = lVar39 + 1;
                  if ((puVar26 <= puVar22) ||
                     (puVar48 = (ulong *)((long)puVar38 + -1), puVar38 <= src)) goto LAB_0069e1e8;
                }
                puVar38 = (ulong *)((long)puVar38 + 1);
              }
            }
            else {
              puVar22 = puVar49;
              puVar20 = iEnd;
              if (uVar28 < uVar40) {
                puVar22 = puVar24;
                puVar20 = puVar19;
              }
              sVar12 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar48 + 4),(BYTE *)((long)puVar26 + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar20,(BYTE *)puVar49);
              lVar39 = sVar12 + 4;
              uVar33 = UVar45 - uVar28;
              if ((puVar22 < puVar26) && (src < puVar48)) {
                puVar26 = (ulong *)(pBVar32 + uVar28);
                do {
                  puVar20 = (ulong *)((long)puVar48 + -1);
                  puVar26 = (ulong *)((long)puVar26 + -1);
                  puVar38 = puVar48;
                  if ((*(BYTE *)puVar20 != *(BYTE *)puVar26) ||
                     (lVar39 = lVar39 + 1, puVar38 = puVar20, puVar26 <= puVar22)) break;
                  puVar48 = puVar20;
                } while (src < puVar20);
              }
            }
LAB_0069e1e8:
            uVar21 = (long)puVar38 - (long)src;
            puVar48 = (ulong *)seqStore->lit;
            if (puVar11 < puVar38) {
              puVar26 = puVar48;
              puVar20 = (ulong *)src;
              if (src <= puVar11) {
                puVar26 = (ulong *)((long)puVar48 + ((long)puVar11 - (long)src));
                uVar25 = *(ulong *)((long)src + 8);
                *puVar48 = *src;
                puVar48[1] = uVar25;
                puVar20 = puVar11;
                if (0x10 < (long)puVar11 - (long)src) {
                  lVar37 = 0x10;
                  do {
                    uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar37) + 8);
                    puVar1 = (undefined8 *)((long)puVar48 + lVar37);
                    *puVar1 = *(undefined8 *)((long)src + lVar37);
                    puVar1[1] = uVar8;
                    pBVar32 = (BYTE *)((long)src + lVar37 + 0x10);
                    uVar8 = *(undefined8 *)(pBVar32 + 8);
                    puVar1[2] = *(undefined8 *)pBVar32;
                    puVar1[3] = uVar8;
                    lVar37 = lVar37 + 0x20;
                  } while (puVar1 + 4 < puVar26);
                }
              }
              if (puVar20 < puVar38) {
                lVar37 = 0;
                do {
                  *(BYTE *)((long)puVar26 + lVar37) = *(BYTE *)((long)puVar20 + lVar37);
                  lVar37 = lVar37 + 1;
                } while ((long)puVar38 - (long)puVar20 != lVar37);
              }
LAB_0069e2fc:
              seqStore->lit = seqStore->lit + uVar21;
              psVar14 = seqStore->sequences;
              if (0xffff < uVar21) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              uVar25 = *(ulong *)((long)src + 8);
              *puVar48 = *src;
              puVar48[1] = uVar25;
              pBVar32 = seqStore->lit;
              if (0x10 < uVar21) {
                uVar25 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar32 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar32 + 0x18) = uVar25;
                if (0x20 < (long)uVar21) {
                  lVar37 = 0;
                  do {
                    pBVar36 = (BYTE *)((long)src + lVar37 + 0x20);
                    uVar8 = *(undefined8 *)(pBVar36 + 8);
                    pBVar29 = pBVar32 + lVar37 + 0x20;
                    *(undefined8 *)pBVar29 = *(undefined8 *)pBVar36;
                    *(undefined8 *)(pBVar29 + 8) = uVar8;
                    pBVar36 = (BYTE *)((long)src + lVar37 + 0x30);
                    uVar8 = *(undefined8 *)(pBVar36 + 8);
                    *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)pBVar36;
                    *(undefined8 *)(pBVar29 + 0x18) = uVar8;
                    lVar37 = lVar37 + 0x20;
                  } while (pBVar29 + 0x20 < pBVar32 + uVar21);
                }
                goto LAB_0069e2fc;
              }
              seqStore->lit = pBVar32 + uVar21;
              psVar14 = seqStore->sequences;
            }
            psVar14->litLength = (U16)uVar21;
            psVar14->offset = uVar33 + 3;
            goto LAB_0069e341;
          }
          puVar48 = (ulong *)((long)puVar48 + ((long)puVar48 - (long)src >> 8) + 1);
        }
LAB_0069e5db:
      } while (puVar48 < puVar3);
    }
    *rep = uVar30;
  }
  else {
    uVar47 = iVar41 - uVar28;
    if (iVar41 - uVar40 <= uVar28) {
      uVar47 = uVar40;
    }
    if (UVar18 != 0) {
      uVar47 = uVar40;
    }
    pBVar27 = pBVar5 + uVar47;
    puVar49 = (ulong *)((ulong)((int)src == (int)pBVar27) + (long)src);
    iVar41 = (int)puVar49 - iVar43;
    uVar33 = iVar41 - uVar28;
    if (iVar41 - uVar40 <= uVar28) {
      uVar33 = uVar40;
    }
    if (UVar18 != 0) {
      uVar33 = uVar40;
    }
    uVar33 = iVar41 - uVar33;
    uVar40 = 0;
    if (uVar33 < uVar34) {
      uVar40 = uVar34;
    }
    uVar21 = (ulong)uVar34;
    if (uVar33 < uVar34) {
      uVar21 = 0;
    }
    uVar34 = (uint)uVar21;
    if (uVar33 < uVar30) {
      uVar40 = uVar30;
    }
    uVar25 = (ulong)uVar30;
    if (uVar33 < uVar30) {
      uVar25 = 0;
    }
    uVar28 = (uint)uVar25;
    if (puVar49 < puVar3) {
      bVar15 = 0x40 - cVar10;
      bVar16 = 0x40 - cVar9;
      bVar17 = 0x20 - cVar9;
      puVar48 = (ulong *)((long)iEnd - 7);
      puVar11 = (ulong *)((long)iEnd - 3);
      puVar19 = (ulong *)((long)iEnd - 1);
      puVar24 = iEnd + -4;
LAB_0069e755:
      uVar35 = *puVar49;
      uVar44 = uVar35 * -0x30e44323485a9b9d;
      uVar42 = uVar44 >> (bVar15 & 0x3f);
      iVar41 = mls - 5;
      switch(iVar41) {
      case 0:
        lVar39 = -0x30e4432345000000;
        break;
      case 1:
        lVar39 = -0x30e4432340650000;
        break;
      case 2:
        lVar39 = -0x30e44323405a9d00;
        break;
      case 3:
        goto switchD_0069e799_caseD_3;
      default:
        uVar44 = (ulong)((uint)((int)uVar35 * -0x61c8864f) >> (bVar17 & 0x1f));
        goto LAB_0069e7de;
      }
      uVar44 = lVar39 * uVar35;
switchD_0069e799_caseD_3:
      uVar44 = uVar44 >> (bVar16 & 0x3f);
LAB_0069e7de:
      UVar18 = (int)puVar49 - iVar43;
      uVar28 = pUVar4[uVar42];
      uVar31 = (ulong)uVar28;
      uVar30 = pUVar6[uVar44];
      uVar13 = (ulong)uVar30;
      pUVar6[uVar44] = UVar18;
      pUVar4[uVar42] = UVar18;
      puVar38 = (ulong *)((long)puVar49 + 1);
      if (((int)uVar25 != 0) && (*(int *)((long)puVar38 - uVar25) == *(int *)((long)puVar49 + 1))) {
        lVar39 = -uVar25;
        puVar26 = (ulong *)((long)puVar49 + 5);
        puVar22 = (ulong *)((long)puVar49 + lVar39 + 5);
        puVar20 = puVar26;
        if (puVar26 < puVar48) {
          if (*puVar22 == *puVar26) {
            lVar37 = 0;
            do {
              puVar20 = (ulong *)((long)puVar49 + lVar37 + 0xd);
              if (puVar48 <= puVar20) {
                puVar22 = (ulong *)((long)puVar49 + lVar39 + lVar37 + 0xd);
                puVar20 = (ulong *)((long)puVar49 + lVar37 + 0xd);
                goto LAB_0069ea7c;
              }
              uVar35 = *(ulong *)((long)puVar49 + lVar37 + lVar39 + 0xd);
              uVar42 = *puVar20;
              lVar37 = lVar37 + 8;
            } while (uVar35 == uVar42);
            uVar42 = uVar42 ^ uVar35;
            uVar35 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            uVar35 = (uVar35 >> 3 & 0x1fffffff) + lVar37;
          }
          else {
            uVar42 = *puVar26 ^ *puVar22;
            uVar35 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            uVar35 = uVar35 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0069ea7c:
          if ((puVar20 < puVar11) && ((int)*puVar22 == (int)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 4);
            puVar22 = (ulong *)((long)puVar22 + 4);
          }
          if ((puVar20 < puVar19) && ((short)*puVar22 == (short)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 2);
            puVar22 = (ulong *)((long)puVar22 + 2);
          }
          if (puVar20 < iEnd) {
            puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar20));
          }
          uVar35 = (long)puVar20 - (long)puVar26;
        }
        uVar42 = (long)puVar38 - (long)src;
        puVar49 = (ulong *)seqStore->lit;
        if (puVar24 < puVar38) {
          puVar26 = puVar49;
          puVar20 = (ulong *)src;
          if (src <= puVar24) {
            puVar26 = (ulong *)((long)puVar49 + ((long)puVar24 - (long)src));
            uVar44 = *(ulong *)((long)src + 8);
            *puVar49 = *src;
            puVar49[1] = uVar44;
            puVar20 = puVar24;
            if (0x10 < (long)puVar24 - (long)src) {
              lVar39 = 0x10;
              do {
                uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar39) + 8);
                puVar1 = (undefined8 *)((long)puVar49 + lVar39);
                *puVar1 = *(undefined8 *)((long)src + lVar39);
                puVar1[1] = uVar8;
                pBVar32 = (BYTE *)((long)src + lVar39 + 0x10);
                uVar8 = *(undefined8 *)(pBVar32 + 8);
                puVar1[2] = *(undefined8 *)pBVar32;
                puVar1[3] = uVar8;
                lVar39 = lVar39 + 0x20;
              } while (puVar1 + 4 < puVar26);
            }
          }
          if (puVar20 < puVar38) {
            lVar39 = 0;
            do {
              *(BYTE *)((long)puVar26 + lVar39) = *(BYTE *)((long)puVar20 + lVar39);
              lVar39 = lVar39 + 1;
            } while ((long)puVar38 - (long)puVar20 != lVar39);
          }
LAB_0069eba5:
          seqStore->lit = seqStore->lit + uVar42;
          psVar14 = seqStore->sequences;
          if (0xffff < uVar42) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar44 = *(ulong *)((long)src + 8);
          *puVar49 = *src;
          puVar49[1] = uVar44;
          pBVar32 = seqStore->lit;
          if (0x10 < uVar42) {
            uVar44 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar32 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar32 + 0x18) = uVar44;
            if (0x20 < (long)uVar42) {
              lVar39 = 0;
              do {
                pBVar36 = (BYTE *)((long)src + lVar39 + 0x20);
                uVar8 = *(undefined8 *)(pBVar36 + 8);
                pBVar29 = pBVar32 + lVar39 + 0x20;
                *(undefined8 *)pBVar29 = *(undefined8 *)pBVar36;
                *(undefined8 *)(pBVar29 + 8) = uVar8;
                pBVar36 = (BYTE *)((long)src + lVar39 + 0x30);
                uVar8 = *(undefined8 *)(pBVar36 + 8);
                *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)pBVar36;
                *(undefined8 *)(pBVar29 + 0x18) = uVar8;
                lVar39 = lVar39 + 0x20;
              } while (pBVar29 + 0x20 < pBVar32 + uVar42);
            }
            goto LAB_0069eba5;
          }
          seqStore->lit = pBVar32 + uVar42;
          psVar14 = seqStore->sequences;
        }
        lVar39 = uVar35 + 4;
        uVar35 = uVar35 + 1;
        psVar14->litLength = (U16)uVar42;
        psVar14->offset = 1;
        uVar44 = uVar25;
        uVar42 = uVar25;
        goto joined_r0x0069ebfd;
      }
      if ((uVar47 < uVar28) && (puVar26 = (ulong *)(pBVar5 + uVar31), *puVar26 == uVar35)) {
        puVar38 = puVar49 + 1;
        puVar20 = puVar26 + 1;
        puVar22 = puVar38;
        if (puVar38 < puVar48) {
          if (*puVar20 == *puVar38) {
            lVar39 = 0;
            do {
              puVar20 = (ulong *)((long)puVar49 + lVar39 + 0x10);
              if (puVar48 <= puVar20) {
                puVar20 = (ulong *)(pBVar5 + lVar39 + uVar31 + 0x10);
                puVar22 = (ulong *)((long)puVar49 + lVar39 + 0x10);
                goto LAB_0069efbb;
              }
              lVar37 = lVar39 + uVar31 + 0x10;
              uVar21 = *puVar20;
              lVar39 = lVar39 + 8;
            } while (*(ulong *)(pBVar5 + lVar37) == uVar21);
            uVar21 = uVar21 ^ *(ulong *)(pBVar5 + lVar37);
            uVar35 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            uVar21 = (uVar35 >> 3 & 0x1fffffff) + lVar39;
          }
          else {
            uVar35 = *puVar38 ^ *puVar20;
            uVar21 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar21 = uVar21 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0069efbb:
          if ((puVar22 < puVar11) && ((int)*puVar20 == (int)*puVar22)) {
            puVar22 = (ulong *)((long)puVar22 + 4);
            puVar20 = (ulong *)((long)puVar20 + 4);
          }
          if ((puVar22 < puVar19) && ((short)*puVar20 == (short)*puVar22)) {
            puVar22 = (ulong *)((long)puVar22 + 2);
            puVar20 = (ulong *)((long)puVar20 + 2);
          }
          if (puVar22 < iEnd) {
            puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar22));
          }
          uVar21 = (long)puVar22 - (long)puVar38;
        }
        lVar39 = uVar21 + 8;
        uVar42 = (long)puVar49 - (long)puVar26;
        puVar38 = puVar49;
        if (src < puVar49) {
          pBVar32 = pBVar5 + (uVar31 - 1);
          do {
            puVar49 = (ulong *)((long)puVar38 + -1);
            if ((*(BYTE *)puVar49 != *pBVar32) ||
               (lVar39 = lVar39 + 1, puVar38 = puVar49, pBVar32 <= pBVar27)) break;
            pBVar32 = pBVar32 + -1;
          } while (src < puVar49);
        }
        goto LAB_0069f106;
      }
      if ((uVar47 < uVar30) && (piVar2 = (int *)(pBVar5 + uVar13), *piVar2 == (int)*puVar49)) {
        uVar21 = *puVar38;
        uVar35 = uVar21 * -0x30e44323485a9b9d >> (bVar15 & 0x3f);
        uVar28 = pUVar4[uVar35];
        uVar44 = (ulong)uVar28;
        pUVar4[uVar35] = UVar18 + 1;
        if ((uVar47 < uVar28) && (puVar26 = (ulong *)(pBVar5 + uVar44), *puVar26 == uVar21)) {
          puVar20 = (ulong *)((long)puVar49 + 9);
          puVar22 = puVar26 + 1;
          puVar23 = puVar20;
          if (puVar20 < puVar48) {
            if (*puVar22 == *puVar20) {
              lVar39 = 0;
              do {
                puVar22 = (ulong *)((long)puVar49 + lVar39 + 0x11);
                if (puVar48 <= puVar22) {
                  puVar22 = (ulong *)(pBVar5 + lVar39 + uVar44 + 0x10);
                  puVar23 = (ulong *)((long)puVar49 + lVar39 + 0x11);
                  goto LAB_0069f267;
                }
                lVar37 = lVar39 + uVar44 + 0x10;
                uVar21 = *puVar22;
                lVar39 = lVar39 + 8;
              } while (*(ulong *)(pBVar5 + lVar37) == uVar21);
              uVar21 = uVar21 ^ *(ulong *)(pBVar5 + lVar37);
              uVar35 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar21 = (uVar35 >> 3 & 0x1fffffff) + lVar39;
            }
            else {
              uVar35 = *puVar20 ^ *puVar22;
              uVar21 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0069f267:
            if ((puVar23 < puVar11) && ((int)*puVar22 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar23 < puVar19) && ((short)*puVar22 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar23 < iEnd) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar23));
            }
            uVar21 = (long)puVar23 - (long)puVar20;
          }
          lVar39 = uVar21 + 8;
          uVar42 = (long)puVar38 - (long)puVar26;
          if (src < puVar38) {
            pBVar32 = pBVar5 + (uVar44 - 1);
            do {
              if ((BYTE)*puVar49 != *pBVar32) goto LAB_0069f2f5;
              lVar39 = lVar39 + 1;
              puVar38 = (ulong *)((long)puVar49 + -1);
            } while ((pBVar27 < pBVar32) &&
                    (pBVar32 = pBVar32 + -1, bVar7 = src < puVar49, puVar49 = puVar38, bVar7));
LAB_0069f2ed:
            puVar38 = (ulong *)((long)puVar38 + 1);
          }
        }
        else {
          puVar38 = (ulong *)((long)puVar49 + 4);
          puVar26 = (ulong *)(piVar2 + 1);
          puVar20 = puVar38;
          if (puVar38 < puVar48) {
            if (*puVar26 == *puVar38) {
              lVar39 = 0;
              do {
                puVar26 = (ulong *)((long)puVar49 + lVar39 + 0xc);
                if (puVar48 <= puVar26) {
                  puVar26 = (ulong *)(pBVar5 + lVar39 + uVar13 + 0xc);
                  puVar20 = (ulong *)((long)puVar49 + lVar39 + 0xc);
                  goto LAB_0069f068;
                }
                lVar37 = lVar39 + uVar13 + 0xc;
                uVar21 = *puVar26;
                lVar39 = lVar39 + 8;
              } while (*(ulong *)(pBVar5 + lVar37) == uVar21);
              uVar21 = uVar21 ^ *(ulong *)(pBVar5 + lVar37);
              uVar35 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar21 = (uVar35 >> 3 & 0x1fffffff) + lVar39;
            }
            else {
              uVar35 = *puVar38 ^ *puVar26;
              uVar21 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0069f068:
            if ((puVar20 < puVar11) && ((int)*puVar26 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar26 = (ulong *)((long)puVar26 + 4);
            }
            if ((puVar20 < puVar19) && ((short)*puVar26 == (short)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar26 = (ulong *)((long)puVar26 + 2);
            }
            if (puVar20 < iEnd) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar20));
            }
            uVar21 = (long)puVar20 - (long)puVar38;
          }
          lVar39 = uVar21 + 4;
          uVar42 = (long)puVar49 - (long)piVar2;
          puVar38 = puVar49;
          if (src < puVar49) {
            pBVar32 = pBVar5 + (uVar13 - 1);
            puVar49 = (ulong *)((long)puVar49 + -1);
            do {
              if ((BYTE)*puVar49 != *pBVar32) goto LAB_0069f2f5;
              lVar39 = lVar39 + 1;
              puVar38 = (ulong *)((long)puVar49 + -1);
            } while ((pBVar27 < pBVar32) &&
                    (pBVar32 = pBVar32 + -1, bVar7 = src < puVar49, puVar49 = puVar38, bVar7));
            goto LAB_0069f2ed;
          }
        }
        goto LAB_0069f106;
      }
      puVar49 = (ulong *)((long)puVar49 + ((long)puVar49 - (long)src >> 8) + 1);
      goto LAB_0069ef4b;
    }
LAB_0069f314:
    if (uVar28 == 0) {
      uVar28 = uVar40;
    }
    *rep = uVar28;
    if (uVar34 == 0) {
      uVar34 = uVar40;
    }
  }
  rep[1] = uVar34;
  return (long)iEnd - (long)src;
LAB_0069f2f5:
  puVar38 = (ulong *)((long)puVar49 + 1);
LAB_0069f106:
  uVar21 = (long)puVar38 - (long)src;
  puVar49 = (ulong *)seqStore->lit;
  if (puVar24 < puVar38) {
    puVar26 = puVar49;
    puVar20 = (ulong *)src;
    if (src <= puVar24) {
      puVar26 = (ulong *)((long)puVar49 + ((long)puVar24 - (long)src));
      uVar35 = *(ulong *)((long)src + 8);
      *puVar49 = *src;
      puVar49[1] = uVar35;
      puVar20 = puVar24;
      if (0x10 < (long)puVar24 - (long)src) {
        lVar37 = 0x10;
        do {
          uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar37) + 8);
          puVar1 = (undefined8 *)((long)puVar49 + lVar37);
          *puVar1 = *(undefined8 *)((long)src + lVar37);
          puVar1[1] = uVar8;
          pBVar32 = (BYTE *)((long)src + lVar37 + 0x10);
          uVar8 = *(undefined8 *)(pBVar32 + 8);
          puVar1[2] = *(undefined8 *)pBVar32;
          puVar1[3] = uVar8;
          lVar37 = lVar37 + 0x20;
        } while (puVar1 + 4 < puVar26);
      }
    }
    if (puVar20 < puVar38) {
      lVar37 = 0;
      do {
        *(BYTE *)((long)puVar26 + lVar37) = *(BYTE *)((long)puVar20 + lVar37);
        lVar37 = lVar37 + 1;
      } while ((long)puVar38 - (long)puVar20 != lVar37);
    }
LAB_0069f1de:
    seqStore->lit = seqStore->lit + uVar21;
    psVar14 = seqStore->sequences;
    if (0xffff < uVar21) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar35 = *(ulong *)((long)src + 8);
    *puVar49 = *src;
    puVar49[1] = uVar35;
    pBVar32 = seqStore->lit;
    if (0x10 < uVar21) {
      uVar35 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar32 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar32 + 0x18) = uVar35;
      if (0x20 < (long)uVar21) {
        lVar37 = 0;
        do {
          pBVar36 = (BYTE *)((long)src + lVar37 + 0x20);
          uVar8 = *(undefined8 *)(pBVar36 + 8);
          pBVar29 = pBVar32 + lVar37 + 0x20;
          *(undefined8 *)pBVar29 = *(undefined8 *)pBVar36;
          *(undefined8 *)(pBVar29 + 8) = uVar8;
          pBVar36 = (BYTE *)((long)src + lVar37 + 0x30);
          uVar8 = *(undefined8 *)(pBVar36 + 8);
          *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)pBVar36;
          *(undefined8 *)(pBVar29 + 0x18) = uVar8;
          lVar37 = lVar37 + 0x20;
        } while (pBVar29 + 0x20 < pBVar32 + uVar21);
      }
      goto LAB_0069f1de;
    }
    seqStore->lit = pBVar32 + uVar21;
    psVar14 = seqStore->sequences;
  }
  uVar35 = lVar39 - 3;
  psVar14->litLength = (U16)uVar21;
  psVar14->offset = (int)uVar42 + 3;
  uVar44 = uVar42 & 0xffffffff;
  uVar21 = uVar25;
joined_r0x0069ebfd:
  uVar25 = uVar44;
  if (0xffff < uVar35) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
    uVar25 = uVar42 & 0xffffffff;
  }
  src = (void *)(lVar39 + (long)puVar38);
  psVar14->matchLength = (U16)uVar35;
  psVar14 = psVar14 + 1;
  seqStore->sequences = psVar14;
  puVar49 = (ulong *)src;
  if (puVar3 < src) goto LAB_0069ef4b;
  uVar28 = UVar18 + 2;
  lVar39 = *(long *)(pBVar5 + uVar28);
  uVar35 = lVar39 * -0x30e44323485a9b9d;
  pUVar4[uVar35 >> (bVar15 & 0x3f)] = uVar28;
  pUVar4[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar15 & 0x3f)] =
       ((int)src + -2) - iVar43;
  switch(iVar41) {
  case 0:
    lVar37 = -0x30e4432345000000;
    break;
  case 1:
    lVar37 = -0x30e4432340650000;
    break;
  case 2:
    lVar37 = -0x30e44323405a9d00;
    break;
  case 3:
    pUVar6[uVar35 >> (bVar16 & 0x3f)] = uVar28;
    uVar35 = *(long *)((long)src + -1) * -0x30e44323485a9b9d;
    goto LAB_0069ed2a;
  default:
    pUVar6[(uint)(*(int *)(pBVar5 + uVar28) * -0x61c8864f) >> (bVar17 & 0x1f)] = uVar28;
    uVar35 = (ulong)((uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar17 & 0x1f));
    goto LAB_0069ed2d;
  }
  pUVar6[(ulong)(lVar39 * lVar37) >> (bVar16 & 0x3f)] = uVar28;
  uVar35 = lVar37 * *(long *)((long)src + -1);
LAB_0069ed2a:
  uVar35 = uVar35 >> (bVar16 & 0x3f);
LAB_0069ed2d:
  pUVar6[uVar35] = ((int)src + -1) - iVar43;
  do {
    uVar35 = uVar21;
    uVar21 = uVar35;
    puVar49 = (ulong *)src;
    if (((int)uVar35 == 0) || ((int)*src != *(int *)((long)src - uVar35))) break;
    lVar39 = -uVar35;
    puVar49 = (ulong *)((long)src + 4);
    puVar26 = (ulong *)((long)src + lVar39 + 4);
    puVar38 = puVar49;
    if (puVar49 < puVar48) {
      if (*puVar26 == *puVar49) {
        lVar37 = 0;
        do {
          puVar38 = (ulong *)((long)src + lVar37 + 0xc);
          if (puVar48 <= puVar38) {
            puVar26 = (ulong *)((long)src + lVar39 + lVar37 + 0xc);
            puVar38 = (ulong *)((long)src + lVar37 + 0xc);
            goto LAB_0069edf2;
          }
          uVar21 = *(ulong *)((long)src + lVar37 + lVar39 + 0xc);
          uVar42 = *puVar38;
          lVar37 = lVar37 + 8;
        } while (uVar21 == uVar42);
        uVar42 = uVar42 ^ uVar21;
        uVar21 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar37;
      }
      else {
        uVar42 = *puVar49 ^ *puVar26;
        uVar21 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar21 = uVar21 >> 3 & 0x1fffffff;
      }
    }
    else {
LAB_0069edf2:
      if ((puVar38 < puVar11) && ((int)*puVar26 == (int)*puVar38)) {
        puVar38 = (ulong *)((long)puVar38 + 4);
        puVar26 = (ulong *)((long)puVar26 + 4);
      }
      if ((puVar38 < puVar19) && ((short)*puVar26 == (short)*puVar38)) {
        puVar38 = (ulong *)((long)puVar38 + 2);
        puVar26 = (ulong *)((long)puVar26 + 2);
      }
      if (puVar38 < iEnd) {
        puVar38 = (ulong *)((long)puVar38 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar38));
      }
      uVar21 = (long)puVar38 - (long)puVar49;
    }
    switch(iVar41) {
    case 0:
      uVar42 = *src;
      lVar39 = -0x30e4432345000000;
      break;
    case 1:
      uVar42 = *src;
      lVar39 = -0x30e4432340650000;
      break;
    case 2:
      uVar42 = *src;
      lVar39 = -0x30e44323405a9d00;
      break;
    case 3:
      uVar42 = *src;
      uVar44 = uVar42 * -0x30e44323485a9b9d;
      goto LAB_0069ee96;
    default:
      uVar44 = (ulong)((uint)((int)*src * -0x61c8864f) >> (bVar17 & 0x1f));
      uVar42 = *src;
      goto LAB_0069ee9e;
    }
    uVar44 = lVar39 * uVar42;
LAB_0069ee96:
    uVar44 = uVar44 >> (bVar16 & 0x3f);
LAB_0069ee9e:
    UVar18 = (int)src - iVar43;
    pUVar6[uVar44] = UVar18;
    pUVar4[uVar42 * -0x30e44323485a9b9d >> (bVar15 & 0x3f)] = UVar18;
    if (src <= puVar24) {
      puVar49 = (ulong *)seqStore->lit;
      uVar42 = *(ulong *)((long)src + 8);
      *puVar49 = *src;
      puVar49[1] = uVar42;
      psVar14 = seqStore->sequences;
    }
    psVar14->litLength = 0;
    psVar14->offset = 1;
    if (0xffff < uVar21 + 1) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar14->matchLength = (U16)(uVar21 + 1);
    psVar14 = psVar14 + 1;
    seqStore->sequences = psVar14;
    src = (void *)((long)src + uVar21 + 4);
    uVar21 = uVar25;
    uVar25 = uVar35;
    puVar49 = (ulong *)src;
  } while (src <= puVar3);
LAB_0069ef4b:
  uVar34 = (uint)uVar21;
  uVar28 = (uint)uVar25;
  if (puVar3 <= puVar49) goto LAB_0069f314;
  goto LAB_0069e755;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, mls, ZSTD_noDict);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 curr = (U32)(ip-base);
        const U32 repIndex = curr + 1 - offset_1;   /* offset_1 expected <= curr +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = curr;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (offset_1 < curr+1 - dictStartIndex)) /* note: we are searching at curr+1 */
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = curr - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = curr + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = curr+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = curr - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = curr+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (offset_2 < current2 - dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}